

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buf.c
# Opt level: O2

void xmlBufEmpty(xmlBufPtr buf)

{
  xmlChar *pxVar1;
  ulong uVar2;
  ulong uVar3;
  xmlChar *pxVar4;
  
  if (((buf == (xmlBufPtr)0x0) || (buf->error != 0)) ||
     (pxVar4 = buf->content, pxVar4 == (xmlChar *)0x0)) {
    return;
  }
  uVar3 = (ulong)buf->compat_size;
  uVar2 = buf->size;
  if (buf->size != uVar3 && uVar3 < 0x7fffffff) {
    buf->size = uVar3;
    uVar2 = uVar3;
  }
  buf->use = 0;
  if (buf->alloc == XML_BUFFER_ALLOC_IO) {
    pxVar1 = buf->contentIO;
    if (pxVar1 != (xmlChar *)0x0) {
      buf->size = (size_t)(pxVar4 + (uVar2 - (long)pxVar1));
      buf->content = pxVar1;
      pxVar4 = pxVar1;
    }
  }
  else if (buf->alloc == XML_BUFFER_ALLOC_IMMUTABLE) {
    buf->content = "";
    uVar3 = 0;
    goto LAB_001363ea;
  }
  *pxVar4 = '\0';
  uVar3 = buf->use;
  uVar2 = buf->size;
LAB_001363ea:
  if (0x7ffffffe < uVar2) {
    uVar2 = 0x7fffffff;
  }
  buf->compat_size = (uint)uVar2;
  uVar2 = 0x7fffffff;
  if (uVar3 < 0x7fffffff) {
    uVar2 = uVar3;
  }
  buf->compat_use = (uint)uVar2;
  return;
}

Assistant:

void
xmlBufEmpty(xmlBufPtr buf) {
    if ((buf == NULL) || (buf->error != 0)) return;
    if (buf->content == NULL) return;
    CHECK_COMPAT(buf)
    buf->use = 0;
    if (buf->alloc == XML_BUFFER_ALLOC_IMMUTABLE) {
        buf->content = BAD_CAST "";
    } else if ((buf->alloc == XML_BUFFER_ALLOC_IO) &&
               (buf->contentIO != NULL)) {
        size_t start_buf = buf->content - buf->contentIO;

	buf->size += start_buf;
        buf->content = buf->contentIO;
        buf->content[0] = 0;
    } else {
        buf->content[0] = 0;
    }
    UPDATE_COMPAT(buf)
}